

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Block(Block *this,BlockContents *contents)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (contents->data).data_;
  this->data_ = pcVar3;
  uVar4 = (contents->data).size_;
  this->size_ = uVar4;
  this->owned_ = contents->heap_allocated;
  if (3 < uVar4) {
    uVar1 = *(uint *)(pcVar3 + (uVar4 - 4));
    if ((ulong)uVar1 <= uVar4 - 4 >> 2) {
      this->restart_offset_ = ((int)uVar4 + uVar1 * -4) - 4;
      goto LAB_00669cbe;
    }
  }
  this->size_ = 0;
LAB_00669cbe:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Block::Block(const BlockContents& contents)
    : data_(contents.data.data()),
      size_(contents.data.size()),
      owned_(contents.heap_allocated) {
  if (size_ < sizeof(uint32_t)) {
    size_ = 0;  // Error marker
  } else {
    size_t max_restarts_allowed = (size_ - sizeof(uint32_t)) / sizeof(uint32_t);
    if (NumRestarts() > max_restarts_allowed) {
      // The size is too small for NumRestarts()
      size_ = 0;
    } else {
      restart_offset_ = size_ - (1 + NumRestarts()) * sizeof(uint32_t);
    }
  }
}